

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

Modifier Corrade::Utility::Debug::boldColor(Color color)

{
  Error local_30;
  
  if ((color < 10) && ((0x2ffU >> (color & 0x1f) & 1) != 0)) {
    return (Modifier)(&PTR_Debug___0017dcd8)[color];
  }
  Error::Error(&local_30,(ostream *)&std::cerr,(Flags)0x0);
  operator<<(&local_30.super_Debug,
             "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:467"
            );
  Error::~Error(&local_30);
  abort();
}

Assistant:

auto Debug::boldColor(Color color) -> Modifier {
    /* Crazy but working solution to work around the need for capturing lambda
       which disallows converting it to function pointer */
    switch(color) {
        #define _c(color) case Color::color: return colorInternal<Color::color, true>();
        _c(Black)
        _c(Red)
        _c(Green)
        _c(Yellow)
        _c(Blue)
        _c(Magenta)
        _c(Cyan)
        _c(White)
        #if !defined(CORRADE_TARGET_WINDOWS) || defined(CORRADE_UTILITY_USE_ANSI_COLORS)
        _c(Default)
        #endif
        #undef _c
    }

    CORRADE_INTERNAL_ASSERT_UNREACHABLE(); /* LCOV_EXCL_LINE */
}